

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::iterate
          (ShaderBuiltinConstantCase<int> *this)

{
  GetConstantValueFunc p_Var1;
  ScopedLogSection SVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *log;
  NotSupportedError *e;
  TestError *e_1;
  undefined1 local_80 [6];
  bool isOk;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  char *shaderTypeName;
  int shaderType;
  int reference;
  ShaderBuiltinConstantCase<int> *this_local;
  
  p_Var1 = this->m_getValue;
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  iVar3 = (*p_Var1)((Functions *)CONCAT44(extraout_var,iVar3));
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  for (shaderTypeName._0_4_ = SHADERTYPE_VERTEX; (int)(ShaderType)shaderTypeName < 6;
      shaderTypeName._0_4_ = (ShaderType)shaderTypeName + SHADERTYPE_FRAGMENT) {
    if ((1 << ((byte)(ShaderType)shaderTypeName & 0x1f) & 0x3fU) != 0) {
      section.m_log = (TestLog *)glu::getShaderTypeName((ShaderType)shaderTypeName);
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
      ;
      SVar2.m_log = section.m_log;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,(char *)SVar2.m_log,&local_49);
      SVar2 = section;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_80,(char *)SVar2.m_log,(allocator<char> *)((long)&e_1 + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_28,log,&local_48,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      e_1._6_1_ = verifyInShaderType(this,(ShaderType)shaderTypeName,iVar3);
      tcu::ScopedLogSection::~ScopedLogSection(&local_28);
    }
  }
  return STOP;
}

Assistant:

TestCase::IterateResult ShaderBuiltinConstantCase<DataType>::iterate (void)
{
	const DataType	reference	= m_getValue(m_context.getRenderContext().getFunctions());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
	{
		if ((SHADER_TYPES & (1<<shaderType)) != 0)
		{
			const char* const			shaderTypeName	= glu::getShaderTypeName(glu::ShaderType(shaderType));
			const tcu::ScopedLogSection	section			(m_testCtx.getLog(), shaderTypeName, shaderTypeName);

			try
			{
				const bool isOk = verifyInShaderType(glu::ShaderType(shaderType), reference);
				DE_ASSERT(isOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
				DE_UNREF(isOk);
			}
			catch (const tcu::NotSupportedError& e)
			{
				m_testCtx.getLog() << TestLog::Message << "Not checking " << shaderTypeName << ": " << e.what() << TestLog::EndMessage;
			}
			catch (const tcu::TestError& e)
			{
				m_testCtx.getLog() << TestLog::Message << e.what() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
			}
		}
	}

	return STOP;
}